

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O0

bool __thiscall
luna::StackAPI::CheckArgs<luna::ValueT>
          (StackAPI *this,int index,int params,ValueT type,ValueT types)

{
  ValueT VVar1;
  ValueT in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  ValueT type_00;
  undefined1 local_1;
  
  if (in_ESI == in_EDX) {
    local_1 = true;
  }
  else {
    VVar1 = GetValueType((StackAPI *)CONCAT44(in_ESI,in_EDX),in_ECX);
    type_00 = (ValueT)((ulong)in_RDI >> 0x20);
    if (VVar1 == in_ECX) {
      local_1 = CheckArgs<>((StackAPI *)CONCAT44(in_ESI + 1,in_EDX),in_ECX,in_R8D,type_00);
    }
    else {
      ArgTypeError((StackAPI *)CONCAT44(in_ECX,in_R8D),type_00,(ValueT)in_RDI);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CheckArgs(int index, int params, ValueT type, ValueTypes... types)
        {
            // All arguments check success
            if (index == params)
                return true;

            // Check type of the index + 1 argument
            if (GetValueType(index) != type)
            {
                ArgTypeError(index, type);
                return false;
            }

            // Check remain arguments
            return CheckArgs(++index, params, types...);
        }